

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

ParamIteratorInterface<TestIntegrator> * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<TestIntegrator>::Iterator::Clone(Iterator *this)

{
  ParamIteratorInterface<TestIntegrator> *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<TestIntegrator> *)operator_new(0x20);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_0313a9c8;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pPVar1[2]._vptr_ParamIteratorInterface = (_func_int **)(this->iterator_)._M_current;
  pPVar1[3]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

virtual ParamIteratorInterface<T>* Clone() const {
      return new Iterator(*this);
    }